

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

unique_ptr<char[],_std::default_delete<char[]>_> __thiscall
QUtil::make_unique_cstr(QUtil *this,string *str)

{
  size_t __n;
  void *__s;
  
  __n = str->_M_string_length;
  __s = operator_new__(__n + 1);
  memset(__s,0,__n + 1);
  *(void **)this = __s;
  *(undefined1 *)((long)__s + __n) = 0;
  memcpy(__s,(str->_M_dataplus)._M_p,__n);
  return (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<char[]>
QUtil::make_unique_cstr(std::string const& str)
{
    auto result = std::make_unique<char[]>(str.length() + 1);
    // Use memcpy in case string contains nulls
    result.get()[str.length()] = '\0';
    memcpy(result.get(), str.c_str(), str.length());
    return result;
}